

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerResults.cpp
# Opt level: O2

void __thiscall
SWDAnalyzerResults::GenerateExportFile
          (SWDAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  undefined8 i;
  undefined8 uVar1;
  ushort uVar2;
  char cVar3;
  ostream *poVar4;
  ulonglong uVar5;
  char *pcVar6;
  ulonglong uVar7;
  allocator local_2a5;
  DisplayBase local_2a4;
  string local_2a0;
  ushort local_280;
  Frame f;
  U32 local_268;
  SWDRegisters SStack_260;
  undefined1 local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  record;
  ofstream of;
  
  local_2a4 = display_base;
  std::ofstream::ofstream(&of,file,_S_out);
  Analyzer::GetTriggerSample();
  Analyzer::GetSampleRate();
  poVar4 = std::operator<<((ostream *)&of,
                           "Time\tType\tR/W\tAP/DP\tRegister\tRequest byte\tACK\tWData\tWData details"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  Frame::Frame(&f);
  uVar5 = AnalyzerResults::GetNumFrames();
  record.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  record.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  record.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar7 = 0;
  do {
    if (uVar5 == uVar7) {
      AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar5);
      break;
    }
    AnalyzerResults::GetFrame((ulonglong)&local_2a0);
    uVar2 = local_280;
    uVar1 = local_2a0.field_2._8_8_;
    i = local_2a0.field_2._M_allocated_capacity;
    _f = local_2a0._M_dataplus._M_p;
    Frame::~Frame((Frame *)&local_2a0);
    local_258 = (undefined1)uVar2;
    switch(local_258) {
    case 2:
      SaveRecord(&record,&of);
      GetSampleTimeStr_abi_cxx11_(&local_2a0,this,(S64)_f);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                 &local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::string((string *)&local_2a0,"Line reset",&local_2a5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                 &local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      SaveRecord(&record,&of);
      break;
    case 3:
      SaveRecord(&record,&of);
      GetSampleTimeStr_abi_cxx11_(&local_2a0,this,(S64)_f);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                 &local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::string((string *)&local_2a0,"Operation",&local_2a5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                 &local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      pcVar6 = "read";
      if ((uVar2 & 0x100) == 0) {
        pcVar6 = "write";
      }
      std::__cxx11::string::string((string *)&local_2a0,pcVar6,&local_2a5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                 &local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      pcVar6 = " AccessPort";
      if ((uVar2 & 0x200) == 0) {
        pcVar6 = " DebugPort";
      }
      std::__cxx11::string::string((string *)&local_2a0,pcVar6 + 1,&local_2a5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                 &local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      SWDRequestFrame::GetRegisterName_abi_cxx11_(&local_2a0,(SWDRequestFrame *)&f);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                 &local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      int2str_sal_abi_cxx11_(&local_2a0,i,local_2a4,8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                 &local_2a0);
      goto LAB_00108358;
    case 5:
      if (i == 4) {
        std::__cxx11::string::string((string *)&local_2a0,"FAULT",&local_2a5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                   &local_2a0);
      }
      else if (i == 2) {
        std::__cxx11::string::string((string *)&local_2a0,"WAIT",&local_2a5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                   &local_2a0);
      }
      else if (i == 1) {
        std::__cxx11::string::string((string *)&local_2a0,"OK",&local_2a5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                   &local_2a0);
      }
      else {
        std::__cxx11::string::string((string *)&local_2a0,"<disc>",&local_2a5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                   &local_2a0);
      }
LAB_00108358:
      std::__cxx11::string::~string((string *)&local_2a0);
      break;
    case 6:
      int2str_sal_abi_cxx11_(&local_2a0,i,local_2a4,0x20);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                 &local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      local_268 = (U32)i;
      SStack_260 = (SWDRegisters)uVar1;
      GetRegisterValueDesc_abi_cxx11_(&local_2a0,SStack_260,local_268,local_2a4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&record,
                 &local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      SaveRecord(&record,&of);
    }
    cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
    uVar7 = uVar7 + 1;
  } while (cVar3 == '\0');
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&record);
  Frame::~Frame(&f);
  std::ofstream::~ofstream(&of);
  return;
}

Assistant:

void SWDAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream of( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    of << "Time\tType\tR/W\tAP/DP\tRegister\tRequest byte\tACK\tWData\tWData details" << std::endl;

    Frame f;
    const U64 num_frames = GetNumFrames();
    std::vector<std::string> record;
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( f.mType == SWDFT_LineReset )
        {
            SaveRecord( record, of );

            record.push_back( GetSampleTimeStr( f.mStartingSampleInclusive ) );
            record.push_back( "Line reset" );
            SaveRecord( record, of );
        }
        else if( f.mType == SWDFT_Request )
        {
            SaveRecord( record, of );

            SWDRequestFrame& req( ( SWDRequestFrame& )f );
            record.push_back( GetSampleTimeStr( f.mStartingSampleInclusive ) );
            record.push_back( "Operation" );
            record.push_back( req.IsRead() ? "read" : "write" );
            record.push_back( req.IsAccessPort() ? "AccessPort" : "DebugPort" );
            record.push_back( req.GetRegisterName() );
            record.push_back( int2str_sal( req.mData1, display_base, 8 ) );
        }
        else if( f.mType == SWDFT_ACK )
        {
            if( f.mData1 == ACK_OK )
                record.push_back( "OK" );
            else if( f.mData1 == ACK_WAIT )
                record.push_back( "WAIT" );
            else if( f.mData1 == ACK_FAULT )
                record.push_back( "FAULT" );
            else
                record.push_back( "<disc>" );
        }
        else if( f.mType == SWDFT_WData )
        {
            record.push_back( int2str_sal( f.mData1, display_base, 32 ) );

            SWDRegisters reg( SWDRegisters( f.mData2 ) );
            record.push_back( GetRegisterValueDesc( reg, U32( f.mData1 ), display_base ) );

            SaveRecord( record, of );
        }

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;
    }

    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}